

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  uint uVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  timeval *__timeout;
  __pid_t _Var5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  __time_t _Var9;
  int *piVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  kwsysProcessTimeNative current_native;
  int local_ec;
  double *local_e8;
  int iStack_d4;
  kwsysProcessTime kStack_c0;
  long local_a8;
  long local_a0;
  char **local_98;
  int *local_90;
  long local_88;
  char *local_80;
  int *local_78;
  timeval local_70;
  double *local_60;
  long local_58;
  timeval *local_50;
  int *local_48;
  timeval local_40;
  
  kStack_c0.tv_sec = 0;
  bVar3 = false;
  iStack_d4 = 0;
  kStack_c0.tv_usec = 0;
  if ((((cp != (cmsysProcess *)0x0) && (cp->State == 3)) && (cp->Killed == 0)) &&
     (cp->TimeoutExpired == 0)) {
    local_98 = data;
    local_90 = length;
    local_60 = userTimeout;
    if (userTimeout == (double *)0x0) {
      local_a0 = 0;
      local_ec = kwsysProcessGetTimeoutTime(cp,(double *)0x0,&kStack_c0);
      local_a8 = 0;
    }
    else {
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      local_a8 = local_70.tv_sec;
      local_a0 = local_70.tv_usec;
      local_ec = kwsysProcessGetTimeoutTime(cp,userTimeout,&kStack_c0);
    }
    if (0 < cp->PipesLeft) {
      bVar15 = local_98 == (char **)0x0;
      bVar16 = local_90 == (int *)0x0;
      local_88 = kStack_c0.tv_sec;
      local_e8 = (double *)0x0;
      local_50 = &local_40;
      if (kStack_c0.tv_sec < 0) {
        local_50 = (timeval *)0x0;
      }
      if (local_ec != 0) {
        local_e8 = userTimeout;
      }
      local_78 = cp->PipeReadEnds;
      __readfds = &cp->PipeSet;
      local_48 = &cp->SignalPipe;
      local_80 = cp->ErrorMessage;
      local_58 = kStack_c0.tv_usec;
LAB_0013ffc5:
      lVar14 = 0;
LAB_0013ffc8:
      uVar13 = local_78[lVar14];
      if (-1 < (int)uVar13) {
        if (((ulong)__readfds->__fds_bits[uVar13 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
          piVar10 = local_78 + lVar14;
          __readfds->__fds_bits[uVar13 >> 6] =
               __readfds->__fds_bits[uVar13 >> 6] & ~(1L << ((byte)uVar13 & 0x3f));
LAB_0014000d:
          sVar7 = read(*piVar10,cp->PipeBuffer,0x400);
          if (sVar7 < 0) goto code_r0x00140023;
          if (sVar7 == 0) goto LAB_00140107;
          if (lVar14 == 2) {
            if (0 < cp->NumberOfCommands) {
              lVar12 = 0;
              do {
                if (cp->ForkPIDs[lVar12] != 0) {
                  do {
                    _Var5 = waitpid(cp->ForkPIDs[lVar12],cp->CommandExitCodes + lVar12,1);
                    if (-1 < _Var5) {
                      if (_Var5 != 0) {
                        cp->ForkPIDs[lVar12] = 0;
                        piVar10 = &cp->CommandsLeft;
                        *piVar10 = *piVar10 + -1;
                        if (*piVar10 == 0) {
                          kwsysProcessCleanupDescriptor(local_48);
                        }
                      }
                      goto LAB_001400f5;
                    }
                    piVar10 = __errno_location();
                  } while (*piVar10 == 4);
                  if (cp->State != 1) {
                    pcVar11 = strerror(*piVar10);
                    strncpy(local_80,pcVar11,0x400);
                    cp->State = 1;
                  }
                }
LAB_001400f5:
                lVar12 = lVar12 + 1;
              } while (lVar12 < cp->NumberOfCommands);
              goto LAB_00140115;
            }
            goto LAB_00140130;
          }
          if (bVar15 || bVar16) goto LAB_00140115;
          *local_98 = cp->PipeBuffer;
          *local_90 = (int)sVar7;
          if ((int)lVar14 == 1) {
            bVar3 = false;
            iStack_d4 = 3;
          }
          else if ((int)lVar14 == 0) {
            bVar3 = false;
            iStack_d4 = 2;
          }
          goto LAB_001402e2;
        }
      }
      goto LAB_00140115;
    }
LAB_001402e2:
    pdVar4 = local_60;
    if (local_60 != (double *)0x0) {
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      lVar12 = local_70.tv_usec - local_a0;
      lVar14 = lVar12 + 1000000;
      if (-1 < lVar12) {
        lVar14 = lVar12;
      }
      dVar2 = *pdVar4 - ((double)lVar14 * 1e-06 +
                        (double)((lVar12 >> 0x3f) + (local_70.tv_sec - local_a8)));
      dVar17 = 0.0;
      if (0.0 <= dVar2) {
        dVar17 = dVar2;
      }
      *pdVar4 = dVar17;
    }
    if (iStack_d4 != 0) {
      return iStack_d4;
    }
    if (bVar3) {
      if (local_ec != 0) {
        return 0xff;
      }
      cmsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
    }
  }
  return 0;
code_r0x00140023:
  piVar8 = __errno_location();
  if (*piVar8 != 4) goto code_r0x0014002f;
  goto LAB_0014000d;
code_r0x0014002f:
  if (*piVar8 != 0xb) {
LAB_00140107:
    kwsysProcessCleanupDescriptor(piVar10);
    cp->PipesLeft = cp->PipesLeft + -1;
  }
LAB_00140115:
  lVar14 = lVar14 + 1;
  if (lVar14 == 3) goto LAB_00140130;
  goto LAB_0013ffc8;
LAB_00140130:
  __timeout = local_50;
  (cp->PipeSet).__fds_bits[0xe] = 0;
  (cp->PipeSet).__fds_bits[0xf] = 0;
  (cp->PipeSet).__fds_bits[0xc] = 0;
  (cp->PipeSet).__fds_bits[0xd] = 0;
  (cp->PipeSet).__fds_bits[10] = 0;
  (cp->PipeSet).__fds_bits[0xb] = 0;
  (cp->PipeSet).__fds_bits[8] = 0;
  (cp->PipeSet).__fds_bits[9] = 0;
  (cp->PipeSet).__fds_bits[6] = 0;
  (cp->PipeSet).__fds_bits[7] = 0;
  (cp->PipeSet).__fds_bits[4] = 0;
  (cp->PipeSet).__fds_bits[5] = 0;
  (cp->PipeSet).__fds_bits[2] = 0;
  (cp->PipeSet).__fds_bits[3] = 0;
  __readfds->__fds_bits[0] = 0;
  (cp->PipeSet).__fds_bits[1] = 0;
  _Var9 = local_40.tv_sec;
  lVar14 = local_40.tv_usec;
  if (local_88 < 0) {
LAB_00140205:
    local_40.tv_usec = lVar14;
    local_40.tv_sec = _Var9;
    uVar13 = 0xffffffff;
    lVar14 = 3;
    do {
      uVar1 = cp->PipeReadEnds[lVar14 + -3];
      if ((-1 < (int)uVar1) &&
         (__readfds->__fds_bits[uVar1 >> 6] =
               __readfds->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f),
         (int)uVar13 < (int)uVar1)) {
        uVar13 = uVar1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 6);
    if ((int)uVar13 < 0) goto LAB_001402e2;
    do {
      iVar6 = select(uVar13 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      if (-1 < iVar6) {
        if (iVar6 != 0) goto LAB_0014029d;
        goto LAB_001402d0;
      }
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    pcVar11 = strerror(*piVar10);
    strncpy(local_80,pcVar11,0x400);
    cmsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->SelectError = 1;
LAB_0014029d:
    if (cp->PipesLeft < 1) goto LAB_001402e2;
    goto LAB_0013ffc5;
  }
  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
  lVar12 = local_58 - local_70.tv_usec;
  _Var9 = (lVar12 >> 0x3f) + (local_88 - local_70.tv_sec);
  if ((local_e8 == (double *)0x0) || (-1 < _Var9)) {
    lVar14 = lVar12 + 1000000;
    if (-1 < lVar12) {
      lVar14 = lVar12;
    }
    if (-1 < _Var9) goto LAB_00140205;
  }
  else if (*local_e8 <= 0.0) {
    _Var9 = 0;
    lVar14 = 0;
    goto LAB_00140205;
  }
LAB_001402d0:
  bVar3 = true;
  iStack_d4 = 0;
  goto LAB_001402e2;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = {0, 0};
  kwsysProcessWaitData wd =
    {
      0,
      kwsysProcess_Pipe_None,
      0,
      0,
      {0, 0}
    };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
     cp->TimeoutExpired)
    {
    return kwsysProcess_Pipe_None;
    }

  /* Record the time at which user timeout period starts.  */
  if(userTimeout)
    {
    userStartTime = kwsysProcessTimeGetCurrent();
    }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout,
                                       &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while(cp->PipesLeft > 0 &&
        !kwsysProcessWaitForPipe(cp, data, length, &wd)) {}

  /* Update the user timeout.  */
  if(userTimeout)
    {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference = kwsysProcessTimeSubtract(userEndTime,
                                                           userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if(*userTimeout < 0)
      {
      *userTimeout = 0;
      }
    }

  /* Check what happened.  */
  if(wd.PipeId)
    {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
    }
  else if(wd.Expired)
    {
    /* A timeout has expired.  */
    if(wd.User)
      {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
      }
    else
      {
      /* The process timeout has expired.  Kill the children now.  */
      kwsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      return kwsysProcess_Pipe_None;
      }
    }
  else
    {
    /* No pipes are left open.  */
    return kwsysProcess_Pipe_None;
    }
}